

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QFileAction.cpp
# Opt level: O3

int __thiscall QFileAction::qt_metacall(QFileAction *this,Call _c,int _id,void **_a)

{
  int iVar1;
  undefined4 in_register_00000014;
  QFileAction *_t;
  void *local_38;
  void *local_30;
  
  iVar1 = QAction::qt_metacall((Call)this,_c,(void **)CONCAT44(in_register_00000014,_id));
  if (-1 < iVar1) {
    if (_c == RegisterMethodArgumentMetaType) {
      if (iVar1 == 0) {
        *(undefined8 *)*_a = 0;
      }
    }
    else {
      if (_c != InvokeMetaMethod) {
        return iVar1;
      }
      if (iVar1 == 0) {
        local_30 = _a[1];
        local_38 = (void *)0x0;
        QMetaObject::activate((QObject *)this,&staticMetaObject,0,&local_38);
      }
    }
    iVar1 = iVar1 + -1;
  }
  return iVar1;
}

Assistant:

int QFileAction::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QAction::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 1)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 1;
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 1)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 1;
    }
    return _id;
}